

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O2

uint32_t ts_lexer__get_column(TSLexer *payload)

{
  uint uVar1;
  uint uVar2;
  uint32_t uVar3;
  
  uVar1 = payload[1].lookahead;
  uVar2 = uVar1 - *(int *)&payload[1].advance;
  payload[1].lookahead = uVar2;
  *(undefined4 *)&payload[1].advance = 0;
  if (uVar2 < *(uint *)&payload[2].is_at_included_range_start) {
    ts_lexer__get_chunk((Lexer *)payload);
  }
  uVar3 = 0;
  while ((uint)payload[1].lookahead < uVar1) {
    ts_lexer__advance(payload,false);
    uVar3 = uVar3 + 1;
  }
  return uVar3;
}

Assistant:

static uint32_t ts_lexer__get_column(TSLexer *payload) {
  Lexer *self = (Lexer *)payload;
  uint32_t goal_byte = self->current_position.bytes;

  self->current_position.bytes -= self->current_position.extent.column;
  self->current_position.extent.column = 0;

  if (self->current_position.bytes < self->chunk_start) {
    ts_lexer__get_chunk(self);
  }

  uint32_t result = 0;
  while (self->current_position.bytes < goal_byte) {
    ts_lexer__advance(payload, false);
    result++;
  }

  return result;
}